

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O3

void __thiscall
glcts::anon_unknown_0::Uniform::setName(Uniform *this,string *parentName,string *_name)

{
  pointer pUVar1;
  ostream *poVar2;
  long lVar3;
  ulong uVar4;
  ostringstream __name;
  ostringstream childParentName;
  string local_360;
  string local_340;
  ostringstream local_320 [112];
  ios_base local_2b0 [264];
  long *local_1a8 [2];
  long local_198 [12];
  ios_base local_138 [264];
  
  std::__cxx11::string::_M_assign((string *)&this->shortName);
  std::__cxx11::ostringstream::ostringstream(local_320);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_320,(parentName->_M_dataplus)._M_p,
                      parentName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,(_name->_M_dataplus)._M_p,_name->_M_string_length);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->name,(string *)local_1a8);
  if (local_1a8[0] != local_198) {
    operator_delete(local_1a8[0],local_198[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_320);
  std::ios_base::~ios_base(local_2b0);
  if (((this->type).baseType == 0) &&
     ((this->childUniforms).
      super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->childUniforms).
      super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    lVar3 = 0;
    uVar4 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream(local_320);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"m",1);
      std::ostream::_M_insert<unsigned_long>((ulong)local_320);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
      UniformType::streamArrayStr
                (&this->type,(ostringstream *)local_1a8,
                 (int)(uVar4 / (ulong)(long)(this->type).arraySize));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".",1);
      pUVar1 = (this->childUniforms).
               super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringbuf::str();
      setName((Uniform *)((long)&(pUVar1->type).enumType + lVar3),&local_360,&local_340);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != &local_340.field_2) {
        operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      std::__cxx11::ostringstream::~ostringstream(local_320);
      std::ios_base::~ios_base(local_2b0);
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x1d8;
    } while (uVar4 < (ulong)(((long)(this->childUniforms).
                                    super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->childUniforms).
                                    super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x34115b1e5f75270d));
  }
  return;
}

Assistant:

void setName(const std::string& parentName, const std::string& _name)
	{
		shortName = _name;
		{
			std::ostringstream __name;
			__name << parentName << _name;
			name = __name.str();
		}
		if (type.isStruct())
		{
			for (size_t i = 0; i < childUniforms.size(); i++)
			{
				std::ostringstream childName;
				childName << "m" << (i % (childUniforms.size() / type.arraySize));
				std::ostringstream childParentName;
				childParentName << name;
				type.streamArrayStr(childParentName, (int)(i / type.arraySize));
				childParentName << ".";
				childUniforms[i].setName(childParentName.str(), childName.str());
			}
		}
	}